

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::DerefInc(SQVM *this,SQInteger op,SQObjectPtr *target,SQObjectPtr *self,SQObjectPtr *key,
              SQObjectPtr *incr,bool postfix,SQInteger selfidx)

{
  byte bVar1;
  bool bVar2;
  SQVM *in_RCX;
  SQObjectPtr *in_RDI;
  SQObjectPtr *in_R8;
  SQObjectPtr *in_R9;
  byte in_stack_00000008;
  SQObjectPtr tkey;
  SQObjectPtr tself;
  SQObjectPtr tmp;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  SQObjectPtr *in_stack_ffffffffffffff80;
  SQInteger in_stack_ffffffffffffff98;
  SQObjectPtr *in_stack_ffffffffffffffa0;
  SQObjectValue in_stack_ffffffffffffffa8;
  SQObjectPtr *in_stack_ffffffffffffffb0;
  SQObjectValue in_stack_ffffffffffffffb8;
  undefined7 in_stack_ffffffffffffffc0;
  bool local_1;
  
  bVar1 = in_stack_00000008 & 1;
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffb0);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffffa0,(SQObjectPtr *)in_RCX);
  ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)&stack0xffffffffffffff80,in_R8);
  bVar2 = Get(in_RCX,in_R8,in_R9,(SQObjectPtr *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),
              in_stack_ffffffffffffffb8.nInteger,(SQInteger)in_stack_ffffffffffffffb0);
  if (bVar2) {
    bVar2 = ARITH_OP(in_RCX,(SQUnsignedInteger)in_R8,in_R9,
                     (SQObjectPtr *)CONCAT17(bVar1,in_stack_ffffffffffffffc0),
                     (SQObjectPtr *)in_stack_ffffffffffffffb8.pTable);
    if (bVar2) {
      bVar2 = Set(in_stack_ffffffffffffffb8.pThread,in_stack_ffffffffffffffb0,
                  (SQObjectPtr *)in_stack_ffffffffffffffa8.pTable,in_stack_ffffffffffffffa0,
                  in_stack_ffffffffffffff98);
      if (bVar2) {
        if ((bVar1 & 1) != 0) {
          ::SQObjectPtr::operator=
                    (in_stack_ffffffffffffff80,
                     (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
        }
        local_1 = true;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  ::SQObjectPtr::~SQObjectPtr(in_RDI);
  return local_1;
}

Assistant:

bool SQVM::DerefInc(SQInteger op,SQObjectPtr &target, SQObjectPtr &self, SQObjectPtr &key, SQObjectPtr &incr, bool postfix,SQInteger selfidx)
{
    SQObjectPtr tmp, tself = self, tkey = key;
    if (!Get(tself, tkey, tmp, 0, selfidx)) { return false; }
    _RET_ON_FAIL(ARITH_OP( op , target, tmp, incr))
    if (!Set(tself, tkey, target,selfidx)) { return false; }
    if (postfix) target = tmp;
    return true;
}